

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task6.cpp
# Opt level: O2

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  char *pcVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double b;
  double c;
  double a;
  double local_50;
  double local_48;
  double local_40;
  
  piVar1 = std::istream::_M_extract<double>((double *)&std::cin);
  piVar1 = std::istream::_M_extract<double>((double *)piVar1);
  std::istream::_M_extract<double>((double *)piVar1);
  if ((local_40 != 0.0) || (NAN(local_40))) {
    dVar6 = local_50 * local_50 + local_40 * -4.0 * local_48;
    if (0.0 <= dVar6) {
      if ((dVar6 != 0.0) || (NAN(dVar6))) {
        std::operator<<((ostream *)&std::cout,"X1 = ");
        dVar4 = SQRT(dVar6);
        dVar5 = dVar4;
        if (dVar6 < 0.0) {
          dVar5 = sqrt(dVar6);
        }
        poVar2 = std::ostream::_M_insert<double>(((dVar5 - local_50) * 0.5) / local_40);
        poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
        std::operator<<(poVar2,"X1 = ");
        if (dVar6 < 0.0) {
          dVar4 = sqrt(dVar6);
        }
        dVar6 = ((-local_50 - dVar4) * 0.5) / local_40;
      }
      else {
        std::operator<<((ostream *)&std::cout,"X = ");
        dVar6 = (local_50 * -0.5) / local_40;
      }
      goto LAB_001013a5;
    }
    pcVar3 = anon_var_dwarf_b65;
  }
  else {
    if ((local_50 != 0.0) || (NAN(local_50))) {
      std::operator<<((ostream *)&std::cout,"X = ");
      dVar6 = -local_48 / local_50;
LAB_001013a5:
      poVar2 = std::ostream::_M_insert<double>(dVar6);
      goto LAB_001013b8;
    }
    if ((local_48 != 0.0) || (NAN(local_48))) {
      pcVar3 = anon_var_dwarf_b39;
    }
    else {
      pcVar3 = anon_var_dwarf_b16;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
LAB_001013b8:
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int
 main (void)
 {
    double a,b,c;
    cin >> a >> b >> c;
    if (!a) // первый коэф нуль
    {
        (!b ? (!c ? cout << "Бесконечно много решений" : cout << "решений нет") : cout << "X = " << -c / b) << endl;
    }
    else
    {
        double D = b*b - 4*a*c;
        if (D<0)
        {
            cout << "Корней нет" << endl;
        }
        else {
            !D ? cout << "X = " << -b / 2 / a << endl : cout << "X1 = " << (-b + sqrt(D)) / 2 / a << endl << "X1 = "
                                                             << (-b - sqrt(D)) / 2 / a << endl;
        }
    }

    return 0;
}